

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MallocV.cpp
# Opt level: O0

vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> * __thiscall
adios2::format::MallocV::DataVec(MallocV *this)

{
  long lVar1;
  size_t sVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  void *pvVar6;
  long in_RSI;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *in_RDI;
  size_t i;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *iov;
  allocator_type *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *in_stack_ffffffffffffffb0;
  size_type sVar7;
  size_type local_20;
  
  std::vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
  ::size((vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
          *)(in_RSI + 0x58));
  std::allocator<adios2::core::iovec>::allocator((allocator<adios2::core::iovec> *)0xadf0b7);
  std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::vector
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::allocator<adios2::core::iovec>::~allocator((allocator<adios2::core::iovec> *)0xadf0d7);
  local_20 = 0;
  while (sVar7 = local_20,
        sVar3 = std::
                vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                ::size((vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                        *)(in_RSI + 0x58)), sVar7 < sVar3) {
    pvVar4 = std::
             vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
             ::operator[]((vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                           *)(in_RSI + 0x58),local_20);
    if ((pvVar4->External & 1U) == 0) {
      lVar1 = *(long *)(in_RSI + 0x80);
      pvVar4 = std::
               vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
               ::operator[]((vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                             *)(in_RSI + 0x58),local_20);
      pvVar6 = (void *)(lVar1 + pvVar4->Offset);
      pvVar5 = std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::operator[]
                         (in_RDI,local_20);
      pvVar5->iov_base = pvVar6;
    }
    else {
      pvVar4 = std::
               vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
               ::operator[]((vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                             *)(in_RSI + 0x58),local_20);
      pvVar6 = pvVar4->Base;
      pvVar5 = std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::operator[]
                         (in_RDI,local_20);
      pvVar5->iov_base = pvVar6;
    }
    pvVar4 = std::
             vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
             ::operator[]((vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                           *)(in_RSI + 0x58),local_20);
    sVar2 = pvVar4->Size;
    pvVar5 = std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::operator[]
                       (in_RDI,local_20);
    pvVar5->iov_len = sVar2;
    local_20 = local_20 + 1;
  }
  return in_RDI;
}

Assistant:

std::vector<core::iovec> MallocV::DataVec() noexcept
{
    std::vector<core::iovec> iov(DataV.size());
    for (std::size_t i = 0; i < DataV.size(); ++i)
    {
        if (DataV[i].External)
        {
            iov[i].iov_base = DataV[i].Base;
        }
        else
        {
            iov[i].iov_base = m_InternalBlock + DataV[i].Offset;
        }
        iov[i].iov_len = DataV[i].Size;
    }
    return iov;
}